

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

void __thiscall
pbrt::PiecewiseConstant1D::PiecewiseConstant1D
          (PiecewiseConstant1D *this,span<const_float> f,Float min,Float max,Allocator alloc)

{
  float **ppfVar1;
  float *pfVar2;
  float *pfVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  byte bVar21;
  byte bVar22;
  ulong uVar23;
  size_t sVar24;
  long lVar25;
  size_t sVar26;
  ulong uVar27;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *__range2;
  ushort uVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 in_ZMM8 [64];
  Float vb;
  Float local_40;
  Float local_3c;
  Float va;
  undefined4 uStack_34;
  
  auVar41 = in_ZMM8._0_16_;
  sVar24 = f.n;
  local_40 = min;
  local_3c = max;
  _va = alloc.memoryResource;
  pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float_const*>
            ((vector<float,pstd::pmr::polymorphic_allocator<float>> *)this,f.ptr,f.ptr + sVar24,
             (polymorphic_allocator<float> *)&va);
  uVar27 = sVar24 + 1;
  (this->cdf).alloc.memoryResource = alloc.memoryResource;
  (this->cdf).nStored = 0;
  (this->cdf).ptr = (float *)0x0;
  (this->cdf).nAlloc = 0;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(&this->cdf,uVar27);
  ppfVar1 = &(this->cdf).ptr;
  if (uVar27 != 0) {
    memset(*ppfVar1,0,uVar27 * 4);
  }
  (this->cdf).nStored = uVar27;
  this->min = local_40;
  this->max = local_3c;
  this->funcInt = 0.0;
  va = local_3c;
  vb = local_40;
  if (local_3c <= local_40) {
    LogFatal<char_const(&)[4],char_const(&)[4],char_const(&)[4],float&,char_const(&)[4],float&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.h"
               ,0x29f,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [4])0x7cd220,
               (char (*) [4])0x7cd212,(char (*) [4])0x7cd220,(float *)&va,(char (*) [4])0x7cd212,&vb
              );
  }
  pfVar2 = (this->func).ptr;
  sVar26 = (this->func).nStored;
  if (sVar26 != 0) {
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar33 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
    uVar23 = sVar26 + 0x3fffffffffffffff;
    auVar34 = vpbroadcastq_avx512f();
    lVar25 = 0;
    do {
      auVar35 = vpbroadcastq_avx512f();
      auVar36 = vporq_avx512f(auVar35,auVar31);
      auVar35 = vporq_avx512f(auVar35,auVar32);
      uVar19 = vpcmpuq_avx512f(auVar35,auVar34,2);
      bVar21 = (byte)uVar19;
      uVar19 = vpcmpuq_avx512f(auVar36,auVar34,2);
      bVar22 = (byte)uVar19;
      uVar28 = CONCAT11(bVar22,bVar21);
      pfVar3 = pfVar2 + lVar25;
      auVar35._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * (int)pfVar3[1];
      auVar35._0_4_ = (uint)(bVar21 & 1) * (int)*pfVar3;
      auVar35._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * (int)pfVar3[2];
      auVar35._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * (int)pfVar3[3];
      auVar35._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * (int)pfVar3[4];
      auVar35._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * (int)pfVar3[5];
      auVar35._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * (int)pfVar3[6];
      auVar35._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * (int)pfVar3[7];
      auVar35._32_4_ = (uint)(bVar22 & 1) * (int)pfVar3[8];
      auVar35._36_4_ = (uint)(bVar22 >> 1 & 1) * (int)pfVar3[9];
      auVar35._40_4_ = (uint)(bVar22 >> 2 & 1) * (int)pfVar3[10];
      auVar35._44_4_ = (uint)(bVar22 >> 3 & 1) * (int)pfVar3[0xb];
      auVar35._48_4_ = (uint)(bVar22 >> 4 & 1) * (int)pfVar3[0xc];
      auVar35._52_4_ = (uint)(bVar22 >> 5 & 1) * (int)pfVar3[0xd];
      auVar35._56_4_ = (uint)(bVar22 >> 6 & 1) * (int)pfVar3[0xe];
      auVar35._60_4_ = (uint)(bVar22 >> 7) * (int)pfVar3[0xf];
      auVar35 = vandps_avx512dq(auVar35,auVar33);
      pfVar3 = pfVar2 + lVar25;
      bVar4 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar5 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar9 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar10 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar11 = (bool)(bVar22 >> 1 & 1);
      bVar12 = (bool)(bVar22 >> 2 & 1);
      bVar13 = (bool)(bVar22 >> 3 & 1);
      bVar14 = (bool)(bVar22 >> 4 & 1);
      bVar15 = (bool)(bVar22 >> 5 & 1);
      bVar16 = (bool)(bVar22 >> 6 & 1);
      *pfVar3 = (float)((uint)(bVar21 & 1) * auVar35._0_4_ |
                       (uint)!(bool)(bVar21 & 1) * (int)*pfVar3);
      pfVar3[1] = (float)((uint)bVar4 * auVar35._4_4_ | (uint)!bVar4 * (int)pfVar3[1]);
      pfVar3[2] = (float)((uint)bVar5 * auVar35._8_4_ | (uint)!bVar5 * (int)pfVar3[2]);
      pfVar3[3] = (float)((uint)bVar6 * auVar35._12_4_ | (uint)!bVar6 * (int)pfVar3[3]);
      pfVar3[4] = (float)((uint)bVar7 * auVar35._16_4_ | (uint)!bVar7 * (int)pfVar3[4]);
      pfVar3[5] = (float)((uint)bVar8 * auVar35._20_4_ | (uint)!bVar8 * (int)pfVar3[5]);
      pfVar3[6] = (float)((uint)bVar9 * auVar35._24_4_ | (uint)!bVar9 * (int)pfVar3[6]);
      pfVar3[7] = (float)((uint)bVar10 * auVar35._28_4_ | (uint)!bVar10 * (int)pfVar3[7]);
      pfVar3[8] = (float)((uint)(bVar22 & 1) * auVar35._32_4_ |
                         (uint)!(bool)(bVar22 & 1) * (int)pfVar3[8]);
      pfVar3[9] = (float)((uint)bVar11 * auVar35._36_4_ | (uint)!bVar11 * (int)pfVar3[9]);
      pfVar3[10] = (float)((uint)bVar12 * auVar35._40_4_ | (uint)!bVar12 * (int)pfVar3[10]);
      pfVar3[0xb] = (float)((uint)bVar13 * auVar35._44_4_ | (uint)!bVar13 * (int)pfVar3[0xb]);
      pfVar3[0xc] = (float)((uint)bVar14 * auVar35._48_4_ | (uint)!bVar14 * (int)pfVar3[0xc]);
      pfVar3[0xd] = (float)((uint)bVar15 * auVar35._52_4_ | (uint)!bVar15 * (int)pfVar3[0xd]);
      pfVar3[0xe] = (float)((uint)bVar16 * auVar35._56_4_ | (uint)!bVar16 * (int)pfVar3[0xe]);
      pfVar3[0xf] = (float)((uint)(bVar22 >> 7) * auVar35._60_4_ |
                           (uint)!(bool)(bVar22 >> 7) * (int)pfVar3[0xf]);
      lVar25 = lVar25 + 0x10;
    } while (((uVar23 & 0x3fffffffffffffff) + 0x10) - (ulong)((uint)uVar23 & 0xf) != lVar25);
  }
  pfVar3 = *ppfVar1;
  *pfVar3 = 0.0;
  if (uVar27 < 2) {
    this->funcInt = pfVar3[sVar24];
  }
  else {
    fVar40 = 0.0;
    sVar26 = 0;
    auVar18 = vcvtusi2ss_avx512f(auVar41,sVar24);
    do {
      va = pfVar2[sVar26];
      vb = 0.0;
      if (va < 0.0) {
        LogFatal<char_const(&)[12],char_const(&)[2],char_const(&)[12],float&,char_const(&)[2],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.h"
                   ,0x2a8,"Check failed: %s >= %s with %s = %s, %s = %s",
                   (char (*) [12])"func[i - 1]",(char (*) [2])0x2c8884a,(char (*) [12])"func[i - 1]"
                   ,(float *)&va,(char (*) [2])0x2c8884a,(int *)&vb);
      }
      fVar40 = fVar40 + ((local_3c - local_40) * va) / auVar18._0_4_;
      pfVar3[sVar26 + 1] = fVar40;
      sVar26 = sVar26 + 1;
    } while (sVar24 != sVar26);
    fVar40 = pfVar3[sVar24];
    this->funcInt = fVar40;
    if ((fVar40 != 0.0) || (NAN(fVar40))) {
      if (1 < uVar27) {
        sVar26 = 0;
        do {
          pfVar3[sVar26 + 1] = pfVar3[sVar26 + 1] / this->funcInt;
          sVar26 = sVar26 + 1;
        } while (sVar24 != sVar26);
      }
    }
    else if (1 < uVar27) {
      auVar31 = vpmovsxbq_avx512f(ZEXT816(0x100f0e0d0c0b0a09));
      auVar32 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
      auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar35 = vpbroadcastq_avx512f(ZEXT816(0x10));
      auVar41 = vcvtusi2ss_avx512f(auVar41,sVar24);
      uVar27 = 0;
      auVar36 = vpbroadcastq_avx512f();
      auVar37 = vbroadcastss_avx512f(auVar41);
      do {
        auVar38 = vpbroadcastq_avx512f();
        auVar29 = vcvtuqq2ps_avx512dq(auVar31);
        auVar31 = vpaddq_avx512f(auVar31,auVar35);
        auVar39 = vporq_avx512f(auVar38,auVar33);
        auVar38 = vporq_avx512f(auVar38,auVar34);
        uVar19 = vpcmpuq_avx512f(auVar38,auVar36,2);
        auVar30 = vcvtuqq2ps_avx512dq(auVar32);
        uVar20 = vpcmpuq_avx512f(auVar39,auVar36,2);
        bVar21 = (byte)uVar20;
        auVar32 = vpaddq_avx512f(auVar32,auVar35);
        uVar28 = CONCAT11(bVar21,(byte)uVar19);
        auVar38 = vinsertf64x4_avx512f(ZEXT3264(auVar30),auVar29,1);
        auVar38 = vdivps_avx512f(auVar38,auVar37);
        pfVar2 = pfVar3 + uVar27 + 1;
        bVar4 = (bool)((byte)uVar19 & 1);
        bVar5 = (bool)((byte)(uVar28 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar28 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar28 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar28 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar28 >> 6) & 1);
        bVar11 = (bool)((byte)(uVar28 >> 7) & 1);
        bVar12 = (bool)(bVar21 >> 1 & 1);
        bVar13 = (bool)(bVar21 >> 2 & 1);
        bVar14 = (bool)(bVar21 >> 3 & 1);
        bVar15 = (bool)(bVar21 >> 4 & 1);
        bVar16 = (bool)(bVar21 >> 5 & 1);
        bVar17 = (bool)(bVar21 >> 6 & 1);
        *pfVar2 = (float)((uint)bVar4 * auVar38._0_4_ | (uint)!bVar4 * (int)*pfVar2);
        pfVar2[1] = (float)((uint)bVar5 * auVar38._4_4_ | (uint)!bVar5 * (int)pfVar2[1]);
        pfVar2[2] = (float)((uint)bVar6 * auVar38._8_4_ | (uint)!bVar6 * (int)pfVar2[2]);
        pfVar2[3] = (float)((uint)bVar7 * auVar38._12_4_ | (uint)!bVar7 * (int)pfVar2[3]);
        pfVar2[4] = (float)((uint)bVar8 * auVar38._16_4_ | (uint)!bVar8 * (int)pfVar2[4]);
        pfVar2[5] = (float)((uint)bVar9 * auVar38._20_4_ | (uint)!bVar9 * (int)pfVar2[5]);
        pfVar2[6] = (float)((uint)bVar10 * auVar38._24_4_ | (uint)!bVar10 * (int)pfVar2[6]);
        pfVar2[7] = (float)((uint)bVar11 * auVar38._28_4_ | (uint)!bVar11 * (int)pfVar2[7]);
        pfVar2[8] = (float)((uint)(bVar21 & 1) * auVar38._32_4_ |
                           (uint)!(bool)(bVar21 & 1) * (int)pfVar2[8]);
        pfVar2[9] = (float)((uint)bVar12 * auVar38._36_4_ | (uint)!bVar12 * (int)pfVar2[9]);
        pfVar2[10] = (float)((uint)bVar13 * auVar38._40_4_ | (uint)!bVar13 * (int)pfVar2[10]);
        pfVar2[0xb] = (float)((uint)bVar14 * auVar38._44_4_ | (uint)!bVar14 * (int)pfVar2[0xb]);
        pfVar2[0xc] = (float)((uint)bVar15 * auVar38._48_4_ | (uint)!bVar15 * (int)pfVar2[0xc]);
        pfVar2[0xd] = (float)((uint)bVar16 * auVar38._52_4_ | (uint)!bVar16 * (int)pfVar2[0xd]);
        pfVar2[0xe] = (float)((uint)bVar17 * auVar38._56_4_ | (uint)!bVar17 * (int)pfVar2[0xe]);
        pfVar2[0xf] = (float)((uint)(bVar21 >> 7) * auVar38._60_4_ |
                             (uint)!(bool)(bVar21 >> 7) * (int)pfVar2[0xf]);
        uVar27 = uVar27 + 0x10;
      } while ((sVar24 + 0xf & 0xfffffffffffffff0) != uVar27);
    }
  }
  return;
}

Assistant:

PiecewiseConstant1D(pstd::span<const Float> f, Float min, Float max,
                        Allocator alloc = {})
        : func(f.begin(), f.end(), alloc), cdf(f.size() + 1, alloc), min(min), max(max) {
        CHECK_GT(max, min);
        // Take absolute value of _func_
        for (Float &f : func)
            f = std::abs(f);

        // Compute integral of step function at $x_i$
        cdf[0] = 0;
        size_t n = f.size();
        for (size_t i = 1; i < n + 1; ++i) {
            CHECK_GE(func[i - 1], 0);
            cdf[i] = cdf[i - 1] + func[i - 1] * (max - min) / n;
        }

        // Transform step function integral into CDF
        funcInt = cdf[n];
        if (funcInt == 0)
            for (size_t i = 1; i < n + 1; ++i)
                cdf[i] = Float(i) / Float(n);
        else
            for (size_t i = 1; i < n + 1; ++i)
                cdf[i] /= funcInt;
    }